

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::SequenceDeclarationSyntax::setChild
          (SequenceDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *pSVar8;
  SequenceExprSyntax *pSVar9;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar10;
  NamedBlockClauseSyntax *pNVar11;
  AssertionItemPortListSyntax *pAVar12;
  logic_error *this_00;
  long *plVar13;
  char *func;
  size_type *psVar14;
  long *plVar15;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (9 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar13 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar13;
    psVar14 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar14) {
      local_b0.field_2._M_allocated_capacity = *psVar14;
      local_b0.field_2._8_8_ = plVar13[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar14;
    }
    local_b0._M_string_length = plVar13[1];
    *plVar13 = (long)psVar14;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x2d2a);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar13;
    plVar15 = plVar13 + 2;
    if (local_90 == plVar15) {
      local_80 = *plVar15;
      lStack_78 = plVar13[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar15;
    }
    local_88 = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar13;
    plVar15 = plVar13 + 2;
    if (local_f0 == plVar15) {
      local_e0 = *plVar15;
      lStack_d8 = plVar13[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar15;
    }
    local_e8 = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar6 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar7);
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar6->super_SyntaxListBase).childCount;
    sVar1 = (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 1:
    pvVar10 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    uVar3 = pvVar10->field_0x2;
    NVar4.raw = (pvVar10->numFlags).raw;
    uVar5 = pvVar10->rawLen;
    pIVar2 = pvVar10->info;
    (this->keyword).kind = pvVar10->kind;
    (this->keyword).field_0x2 = uVar3;
    (this->keyword).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->keyword).rawLen = uVar5;
    (this->keyword).info = pIVar2;
    break;
  case 2:
    pvVar10 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    uVar3 = pvVar10->field_0x2;
    NVar4.raw = (pvVar10->numFlags).raw;
    uVar5 = pvVar10->rawLen;
    pIVar2 = pvVar10->info;
    (this->name).kind = pvVar10->kind;
    (this->name).field_0x2 = uVar3;
    (this->name).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->name).rawLen = uVar5;
    (this->name).info = pIVar2;
    break;
  case 3:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pAVar12 = (AssertionItemPortListSyntax *)0x0;
    }
    else {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pAVar12 = (AssertionItemPortListSyntax *)*ppSVar7;
      if ((pAVar12->super_SyntaxNode).kind != AssertionItemPortList) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::AssertionItemPortListSyntax]"
        ;
LAB_002ee240:
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,func);
      }
    }
    this->portList = pAVar12;
    break;
  case 4:
    pvVar10 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    uVar3 = pvVar10->field_0x2;
    NVar4.raw = (pvVar10->numFlags).raw;
    uVar5 = pvVar10->rawLen;
    pIVar2 = pvVar10->info;
    (this->semi).kind = pvVar10->kind;
    (this->semi).field_0x2 = uVar3;
    (this->semi).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->semi).rawLen = uVar5;
    (this->semi).info = pIVar2;
    break;
  case 5:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar8 = SyntaxNode::
             as<slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>>(*ppSVar7);
    (this->variables).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->variables).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->variables).super_SyntaxListBase.childCount = (pSVar8->super_SyntaxListBase).childCount;
    sVar1 = (pSVar8->
            super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>).
            size_;
    (this->variables).
    super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar8->
         super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>).data_;
    (this->variables).
    super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.size_ =
         sVar1;
    break;
  case 6:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,
                 "slang::not_null<slang::syntax::SequenceExprSyntax *>::not_null(U &&) [T = slang::syntax::SequenceExprSyntax *, U = slang::syntax::SequenceExprSyntax *]"
                );
    }
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar9 = SyntaxNode::as<slang::syntax::SequenceExprSyntax>(*ppSVar7);
    (this->seqExpr).ptr = pSVar9;
    break;
  case 7:
    pvVar10 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    uVar3 = pvVar10->field_0x2;
    NVar4.raw = (pvVar10->numFlags).raw;
    uVar5 = pvVar10->rawLen;
    pIVar2 = pvVar10->info;
    (this->optionalSemi).kind = pvVar10->kind;
    (this->optionalSemi).field_0x2 = uVar3;
    (this->optionalSemi).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->optionalSemi).rawLen = uVar5;
    (this->optionalSemi).info = pIVar2;
    break;
  case 8:
    pvVar10 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    uVar3 = pvVar10->field_0x2;
    NVar4.raw = (pvVar10->numFlags).raw;
    uVar5 = pvVar10->rawLen;
    pIVar2 = pvVar10->info;
    (this->end).kind = pvVar10->kind;
    (this->end).field_0x2 = uVar3;
    (this->end).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->end).rawLen = uVar5;
    (this->end).info = pIVar2;
    break;
  case 9:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar11 = (NamedBlockClauseSyntax *)0x0;
    }
    else {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pNVar11 = (NamedBlockClauseSyntax *)*ppSVar7;
      if ((pNVar11->super_SyntaxNode).kind != NamedBlockClause) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::NamedBlockClauseSyntax]";
        goto LAB_002ee240;
      }
    }
    this->endBlockName = pNVar11;
  }
  return;
}

Assistant:

void SequenceDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: name = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<AssertionItemPortListSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        case 5: variables = child.node()->as<SyntaxList<LocalVariableDeclarationSyntax>>(); return;
        case 6: seqExpr = child.node() ? &child.node()->as<SequenceExprSyntax>() : nullptr; return;
        case 7: optionalSemi = child.token(); return;
        case 8: end = child.token(); return;
        case 9: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}